

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CheckerInstanceSymbol *symbol)

{
  Connection *this_00;
  Connection *conn;
  long lVar1;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar2;
  
  if ((*this->numErrors <= (ulong)this->errorLimit) && ((this->hierarchyProblem & 1U) == 0)) {
    handle(this,symbol->body);
    if ((*this->numErrors <= (ulong)this->errorLimit) && ((this->hierarchyProblem & 1U) == 0)) {
      sVar2 = CheckerInstanceSymbol::getPortConnections(symbol);
      this_00 = sVar2._M_ptr;
      for (lVar1 = sVar2._M_extent._M_extent_value._M_extent_value * 0x48; lVar1 != 0;
          lVar1 = lVar1 + -0x48) {
        CheckerInstanceSymbol::Connection::getOutputInitialExpr(this_00);
        this_00 = this_00 + 1;
      }
      CheckerInstanceSymbol::verifyMembers(symbol);
      return;
    }
  }
  return;
}

Assistant:

bool finishedEarly() const { return numErrors > errorLimit || hierarchyProblem; }